

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

void __thiscall re2::CharClassBuilder::RemoveAbove(CharClassBuilder *this,Rune r)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  const_iterator __position;
  RuneRange rr;
  RuneRange local_30;
  
  if (r < 0x10ffff) {
    if (r < 0x7a) {
      if (r < 0x61) {
        this->lower_ = 0;
        if (r < 0x5a) {
          if (r < 0x41) {
            this->upper_ = 0;
          }
          else {
            this->upper_ = this->upper_ & 0x3ffffffU >> (0x5aU - (char)r & 0x1f);
          }
        }
      }
      else {
        this->lower_ = this->lower_ & 0x3ffffffU >> (0x7aU - (char)r & 0x1f);
      }
    }
    p_Var2 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var2 != (_Base_ptr)0x0) {
      p_Var1 = &(this->ranges_)._M_t._M_impl.super__Rb_tree_header;
      __position._M_node = &p_Var1->_M_header;
      do {
        do {
          if (r < *(int *)&p_Var2[1].field_0x4) {
            __position._M_node = p_Var2;
          }
          p_Var2 = (&p_Var2->_M_left)[*(int *)&p_Var2[1].field_0x4 <= r];
        } while (p_Var2 != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)__position._M_node == p_Var1) {
          return;
        }
        if (0x10ffff < (int)__position._M_node[1]._M_color) {
          return;
        }
        local_30.lo = __position._M_node[1]._M_color;
        local_30.hi = *(Rune *)&__position._M_node[1].field_0x4;
        std::
        _Rb_tree<re2::RuneRange,re2::RuneRange,std::_Identity<re2::RuneRange>,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
        ::erase_abi_cxx11_((_Rb_tree<re2::RuneRange,re2::RuneRange,std::_Identity<re2::RuneRange>,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
                            *)&this->ranges_,__position);
        this->nrunes_ = this->nrunes_ + ~local_30.hi + local_30.lo;
        if (local_30.lo <= r) {
          local_30.hi = r;
          std::
          _Rb_tree<re2::RuneRange,re2::RuneRange,std::_Identity<re2::RuneRange>,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
          ::_M_insert_unique<re2::RuneRange_const&>
                    ((_Rb_tree<re2::RuneRange,re2::RuneRange,std::_Identity<re2::RuneRange>,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
                      *)&this->ranges_,&local_30);
          this->nrunes_ = (local_30.hi - local_30.lo) + this->nrunes_ + 1;
        }
        p_Var2 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        __position._M_node = &p_Var1->_M_header;
      } while (p_Var2 != (_Base_ptr)0x0);
    }
  }
  return;
}

Assistant:

void CharClassBuilder::RemoveAbove(Rune r) {
  if (r >= Runemax)
    return;

  if (r < 'z') {
    if (r < 'a')
      lower_ = 0;
    else
      lower_ &= AlphaMask >> ('z' - r);
  }

  if (r < 'Z') {
    if (r < 'A')
      upper_ = 0;
    else
      upper_ &= AlphaMask >> ('Z' - r);
  }

  for (;;) {

    iterator it = ranges_.find(RuneRange(r + 1, Runemax));
    if (it == end())
      break;
    RuneRange rr = *it;
    ranges_.erase(it);
    nrunes_ -= rr.hi - rr.lo + 1;
    if (rr.lo <= r) {
      rr.hi = r;
      ranges_.insert(rr);
      nrunes_ += rr.hi - rr.lo + 1;
    }
  }
}